

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int do_check_string(ASN1_STRING *a,int cmp_type,equal_fn equal,uint flags,int check_type,char *b,
                   size_t blen,char **peername)

{
  int iVar1;
  char *pcVar2;
  uchar *local_48;
  uchar *astr;
  int astrlen;
  int rv;
  char *b_local;
  int check_type_local;
  uint flags_local;
  equal_fn equal_local;
  ASN1_STRING *pAStack_18;
  int cmp_type_local;
  ASN1_STRING *a_local;
  
  astr._4_4_ = 0;
  if ((a->data == (uchar *)0x0) || (a->length == 0)) {
    a_local._4_4_ = 0;
  }
  else {
    _astrlen = (uchar *)b;
    b_local._0_4_ = check_type;
    b_local._4_4_ = flags;
    _check_type_local = equal;
    equal_local._4_4_ = cmp_type;
    pAStack_18 = a;
    if (cmp_type < 1) {
      astr._0_4_ = ASN1_STRING_to_UTF8(&local_48,(ASN1_STRING *)a);
      if ((int)astr < 0) {
        return -1;
      }
      if (((int)b_local == 2) &&
         (iVar1 = x509v3_looks_like_dns_name(local_48,(long)(int)astr), iVar1 == 0)) {
        astr._4_4_ = 0;
      }
      else {
        astr._4_4_ = (*_check_type_local)(local_48,(long)(int)astr,_astrlen,blen,b_local._4_4_);
      }
      if ((0 < astr._4_4_) && (peername != (char **)0x0)) {
        pcVar2 = OPENSSL_strndup((char *)local_48,(long)(int)astr);
        *peername = pcVar2;
        if (*peername == (char *)0x0) {
          return -1;
        }
      }
      OPENSSL_free(local_48);
    }
    else {
      if (cmp_type != a->type) {
        return 0;
      }
      if (cmp_type == 0x16) {
        astr._4_4_ = (*equal)(a->data,(long)a->length,(uchar *)b,blen,flags);
      }
      else if ((a->length == (int)blen) && (iVar1 = OPENSSL_memcmp(a->data,b,blen), iVar1 == 0)) {
        astr._4_4_ = 1;
      }
      if ((0 < astr._4_4_) && (peername != (char **)0x0)) {
        pcVar2 = OPENSSL_strndup((char *)pAStack_18->data,(long)pAStack_18->length);
        *peername = pcVar2;
        if (*peername == (char *)0x0) {
          return -1;
        }
      }
    }
    a_local._4_4_ = astr._4_4_;
  }
  return a_local._4_4_;
}

Assistant:

static int do_check_string(const ASN1_STRING *a, int cmp_type, equal_fn equal,
                           unsigned int flags, int check_type, const char *b,
                           size_t blen, char **peername) {
  int rv = 0;

  if (!a->data || !a->length) {
    return 0;
  }
  if (cmp_type > 0) {
    if (cmp_type != a->type) {
      return 0;
    }
    if (cmp_type == V_ASN1_IA5STRING) {
      rv = equal(a->data, a->length, (unsigned char *)b, blen, flags);
    } else if (a->length == (int)blen && !OPENSSL_memcmp(a->data, b, blen)) {
      rv = 1;
    }
    if (rv > 0 && peername) {
      *peername = OPENSSL_strndup((char *)a->data, a->length);
      if (*peername == NULL) {
        return -1;
      }
    }
  } else {
    int astrlen;
    unsigned char *astr;
    astrlen = ASN1_STRING_to_UTF8(&astr, a);
    if (astrlen < 0) {
      return -1;
    }
    // We check the common name against DNS name constraints if it passes
    // |x509v3_looks_like_dns_name|. Thus we must not consider common names
    // for DNS fallbacks if they fail this check.
    if (check_type == GEN_DNS && !x509v3_looks_like_dns_name(astr, astrlen)) {
      rv = 0;
    } else {
      rv = equal(astr, astrlen, (unsigned char *)b, blen, flags);
    }
    if (rv > 0 && peername) {
      *peername = OPENSSL_strndup((char *)astr, astrlen);
      if (*peername == NULL) {
        return -1;
      }
    }
    OPENSSL_free(astr);
  }
  return rv;
}